

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_ComponentNodeHasFieldNodeWithMissingNameAttribute::
TestreadFromDocument_ComponentNodeHasFieldNodeWithMissingNameAttribute
          (TestreadFromDocument_ComponentNodeHasFieldNodeWithMissingNameAttribute *this)

{
  char *suiteName;
  TestreadFromDocument_ComponentNodeHasFieldNodeWithMissingNameAttribute *this_local;
  
  suiteName = SuiteDataDictionaryTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"readFromDocument_ComponentNodeHasFieldNodeWithMissingNameAttribute",
             suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/DataDictionaryTestCase.cpp"
             ,0x6fa);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__TestreadFromDocument_ComponentNodeHasFieldNodeWithMissingNameAttribute_004571f0;
  return;
}

Assistant:

TEST(readFromDocument_ComponentNodeHasFieldNodeWithMissingNameAttribute) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml =
      "<fix type='FIX' major='4' minor='2' servicepack='0'>"
        "<header>"
          "<field name='BeginString' required='Y' />"
        "</header>"
        "<fields>"
          "<field number='8' name='BeginString' type='STRING' >"
            "<value enum='1' description='SINGLE_SECURITY' />"
          "</field>"
          "<field number='93' name='SignatureLength' type='STRING' />"
          "<field number='627' name='NoHops' type='NUMINGROUP' />"
          "<field number='628' name='HopCompID' type='STRING' />"
          "<field number='55' name='Symbol' type='STRING' />"
        "</fields>"
        "<messages>"
          "<message name='Advertisement' msgtype='7' msgcat='app'>"
            "<field name='BeginString' required='Y' />"
            "<component name='Instrument' required='Y' />"
          "</message>"
        "</messages>"
        "<trailer>"
          "<field name='SignatureLength' required='Y' />"
          "<group name='NoHops' required='N'>"
             "<field name='HopCompID' required='N' />"
          "</group>"
        "</trailer>"
        "<components>"
          "<component name='Instrument'>"
            "<field required='N' />" //Missing Name Attribute
          "</component>"
        "</components>"
      "</fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}